

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svg.cpp
# Opt level: O2

void __thiscall CGL::Triangle::draw(Triangle *this,DrawRend *dr,Matrix3x3 *global_transform)

{
  long lVar1;
  Vector2D *pVVar2;
  Matrix3x3 *pMVar3;
  byte bVar4;
  Vector2D p2_scr;
  Vector2D p1_scr;
  Vector2D p0_scr;
  
  bVar4 = 0;
  Matrix3x3::operator*((Matrix3x3 *)&p0_scr,global_transform,&(this->super_SVGElement).transform);
  pVVar2 = &p0_scr;
  pMVar3 = global_transform;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    pMVar3->entries[0].x = ((Vector3D *)&pVVar2->x)->x;
    pVVar2 = (Vector2D *)&pVVar2[-(ulong)bVar4].y;
    pMVar3 = (Matrix3x3 *)((long)pMVar3 + ((ulong)bVar4 * -2 + 1) * 8);
  }
  operator*((CGL *)&p0_scr,global_transform,&this->p0_svg);
  operator*((CGL *)&p1_scr,global_transform,&this->p1_svg);
  operator*((CGL *)&p2_scr,global_transform,&this->p2_svg);
  DrawRend::rasterize_triangle
            (dr,(float)p0_scr.x,(float)p0_scr.y,(float)p1_scr.x,(float)p1_scr.y,(float)p2_scr.x,
             (float)p2_scr.y,(Color)ZEXT412(0),this);
  return;
}

Assistant:

void Triangle::draw(DrawRend *dr, Matrix3x3 global_transform) {
  global_transform = global_transform * transform;

  Vector2D p0_scr = global_transform * p0_svg;
  Vector2D p1_scr = global_transform * p1_svg;
  Vector2D p2_scr = global_transform * p2_svg;

  // draw fill. Here the color field is empty, since children
  // export their own more sophisticated color() method.
  dr->rasterize_triangle( p0_scr.x, p0_scr.y, p1_scr.x, p1_scr.y, p2_scr.x, p2_scr.y, Color(), this );

}